

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O1

void __thiscall
Args::AllOfGroup::checkCorrectnessBeforeParsing
          (AllOfGroup *this,StringList *flags,StringList *names)

{
  pointer puVar1;
  ArgIface *pAVar2;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  logic_error *this_00;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  ulong *puVar9;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar10;
  ulong *local_130;
  undefined8 local_120;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (this->super_GroupIface).m_children.
                 super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1; puVar10 = puVar10 + 1
      ) {
    pAVar2 = (puVar10->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    (*pAVar2->_vptr_ArgIface[0x10])(pAVar2,flags,names);
  }
  puVar10 = (this->super_GroupIface).m_children.
            super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_GroupIface).m_children.
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar10 == puVar1) {
      return;
    }
    iVar5 = (*((puVar10->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[5])();
    if ((char)iVar5 != '\0') break;
    puVar10 = puVar10 + 1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Required argument \"","");
  (*((puVar10->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
     _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
     super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[3])(&local_90);
  std::operator+(&local_70,&local_b0,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d0 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (local_d0 == plVar7) {
    local_c0 = *plVar7;
    lStack_b8 = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar7;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_110._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar8) {
    local_110.field_2._M_allocated_capacity = *psVar8;
    local_110.field_2._8_4_ = (undefined4)plVar6[3];
    local_110.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar8;
  }
  local_110._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar3 = (this->super_GroupIface).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + (this->super_GroupIface).m_name._M_string_length);
  std::operator+(&local_50,&local_110,&local_f0);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_130 = (ulong *)*plVar6;
  puVar9 = (ulong *)(plVar6 + 2);
  if (local_130 == puVar9) {
    local_120 = *puVar9;
    uStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar9;
  }
  lVar4 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_001725a0;
  *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
  if (local_130 == &local_120) {
    *(undefined4 *)(this_00 + 0x20) = (undefined4)local_120;
    *(undefined4 *)(this_00 + 0x24) = local_120._4_4_;
    *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_118;
    *(undefined4 *)(this_00 + 0x2c) = uStack_118._4_4_;
  }
  else {
    *(ulong **)(this_00 + 0x10) = local_130;
    *(ulong *)(this_00 + 0x20) = local_120;
  }
  *(long *)(this_00 + 0x18) = lVar4;
  local_120 = local_120 & 0xffffffffffffff00;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void checkCorrectnessBeforeParsing(
		//! All known flags.
		StringList & flags,
		//! All known names.
		StringList & names ) const override
	{
		GroupIface::checkCorrectnessBeforeParsing( flags, names );

		for( const auto & arg : details::asConst( children() ) )
		{
			if( arg->isRequired() )
				throw BaseException( String( SL( "Required argument \"" ) ) +
					arg->name() +
					SL( "\" is not allowed to " ) +
					SL( "be in AllOf group \"" ) + name() + SL( "\"." ) );
		}
	}